

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FMultiBlockThingsIterator::FMultiBlockThingsIterator
          (FMultiBlockThingsIterator *this,FPortalGroupArray *check,AActor *origin,
          double checkradius,bool ignorerestricted)

{
  int startgroup;
  double upperz;
  double local_88;
  DVector3 local_58;
  undefined1 local_29;
  double dStack_28;
  bool ignorerestricted_local;
  double checkradius_local;
  AActor *origin_local;
  FPortalGroupArray *check_local;
  FMultiBlockThingsIterator *this_local;
  
  this->checklist = check;
  local_29 = ignorerestricted;
  dStack_28 = checkradius;
  checkradius_local = (double)origin;
  origin_local = (AActor *)check;
  check_local = (FPortalGroupArray *)this;
  TVector3<double>::TVector3(&this->checkpoint);
  FBlockThingsIterator::FBlockThingsIterator(&this->blockIterator);
  FBoundingBox::FBoundingBox(&this->bbox);
  AActor::Pos(&local_58,(AActor *)checkradius_local);
  TVector3<double>::operator=(&this->checkpoint,&local_58);
  if (((ulong)(origin_local->super_DThinker).super_DObject._vptr_DObject & 1) == 0) {
    startgroup = *(int *)(*(long *)((long)checkradius_local + 0x130) + 0x208);
    upperz = AActor::Top((AActor *)checkradius_local);
    P_CollectConnectedGroups(startgroup,&this->checkpoint,upperz,dStack_28,this->checklist);
  }
  if ((dStack_28 != -1.0) || (NAN(dStack_28))) {
    local_88 = dStack_28;
  }
  else {
    local_88 = *(double *)((long)checkradius_local + 0x178);
  }
  (this->checkpoint).Z = local_88;
  this->basegroup = *(short *)(*(long *)((long)checkradius_local + 0x130) + 0x208);
  Reset(this);
  return;
}

Assistant:

FMultiBlockThingsIterator::FMultiBlockThingsIterator(FPortalGroupArray &check, AActor *origin, double checkradius, bool ignorerestricted)
	: checklist(check)
{
	checkpoint = origin->Pos();
	if (!check.inited) P_CollectConnectedGroups(origin->Sector->PortalGroup, checkpoint, origin->Top(), checkradius, checklist);
	checkpoint.Z = checkradius == -1? origin->radius : checkradius;
	basegroup = origin->Sector->PortalGroup;
	Reset();
}